

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledPixel.cxx
# Opt level: O0

void __thiscall SSD1306::OledPixel::setFrom(OledPixel *this,OledPixel *pixels,OledPoint offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  long *in_RSI;
  long *in_RDI;
  OledPoint outputP;
  OledPoint inputP;
  int x;
  int y;
  int yEnd;
  int yStart;
  int xEnd;
  int xStart;
  Point<int> local_60;
  Point<int> local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c [3];
  int local_30;
  int local_2c;
  int local_28;
  int local_24 [3];
  long *local_18;
  Point<int> local_8;
  
  local_24[1] = 0;
  local_18 = in_RSI;
  local_24[0] = Point<int>::x(&local_8);
  piVar5 = std::max<int>(local_24 + 1,local_24);
  local_24[2] = *piVar5;
  local_2c = (**(code **)(*in_RDI + 0x40))();
  iVar2 = (**(code **)(*local_18 + 0x40))();
  local_30 = Point<int>::x(&local_8);
  local_30 = iVar2 + local_30;
  piVar5 = std::min<int>(&local_2c,&local_30);
  local_28 = *piVar5;
  local_3c[1] = 0;
  local_3c[0] = Point<int>::y(&local_8);
  piVar5 = std::max<int>(local_3c + 1,local_3c);
  local_3c[2] = *piVar5;
  local_44 = (**(code **)(*in_RDI + 0x48))();
  iVar2 = (**(code **)(*local_18 + 0x48))();
  local_48 = Point<int>::y(&local_8);
  local_48 = iVar2 + local_48;
  piVar5 = std::min<int>(&local_44,&local_48);
  local_40 = *piVar5;
  for (local_4c = local_3c[2]; local_4c < local_40; local_4c = local_4c + 1) {
    for (local_50 = local_24[2]; iVar2 = local_50, local_50 < local_28; local_50 = local_50 + 1) {
      iVar3 = Point<int>::x(&local_8);
      iVar1 = local_4c;
      iVar4 = Point<int>::y(&local_8);
      Point<int>::Point(&local_58,iVar2 - iVar3,iVar1 - iVar4);
      Point<int>::Point(&local_60,local_50,local_4c);
      uVar6 = (**(code **)(*local_18 + 0x20))(local_18,local_58);
      if ((uVar6 & 1) == 0) {
        (**(code **)(*in_RDI + 0x30))(in_RDI,local_60);
      }
      else {
        (**(code **)(*in_RDI + 0x28))(in_RDI,local_60);
      }
    }
  }
  return;
}

Assistant:

void
SSD1306::OledPixel::setFrom(
    const OledPixel& pixels,
    SSD1306::OledPoint offset)
{
    auto xStart = std::max(0, offset.x());
    auto xEnd = std::min(width(), pixels.width() + offset.x());
    auto yStart = std::max(0, offset.y());
    auto yEnd = std::min(height(), pixels.height() + offset.y());

    for (auto y = yStart ; y < yEnd ; ++y)
    {
        for (auto x = xStart ; x < xEnd ; ++x)
        {
            OledPoint inputP{x - offset.x(), y - offset.y()};
            OledPoint outputP{x, y};

            if (pixels.isSetPixel(inputP))
            {
                setPixel(outputP);
            }
            else
            {
                unsetPixel(outputP);
            }
        }
    }
}